

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O3

void __thiscall solitaire::Solitaire::tryAddCardsOnTableauPile(Solitaire *this,PileId *id)

{
  int iVar1;
  PileId local_14;
  
  throwExceptionOnInvalidTableauPileId(this,&local_14);
  iVar1 = (*(this->super_Solitaire)._vptr_Solitaire[0xc])(this);
  if (((char)iVar1 == '\0') &&
     ((this->cardsInHand).
      super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->cardsInHand).
      super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    tryAddCardOnTableauPileFromHand(this,(this->tableauPiles)._M_elems + id->t);
    return;
  }
  return;
}

Assistant:

void Solitaire::tryAddCardsOnTableauPile(const PileId id) {
    throwExceptionOnInvalidTableauPileId(id);
    if (isGameInProgressAndHandContainsCards())
        tryAddCardOnTableauPileFromHand(tableauPiles[id]);
}